

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  undefined1 auVar1 [16];
  uint newSize;
  uint uVar2;
  int iVar3;
  hash_t hVar4;
  SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *dst;
  int *piVar5;
  size_t byteSize;
  ulong dstCount;
  long lVar6;
  long lVar7;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  newSize = this->count * 2;
  local_34[0] = 0x4b;
  uVar2 = 4;
  if (8 < newSize) {
    uVar2 = this->count & 0x7fffffff;
  }
  uVar2 = PrimePolicy::GetPrime(uVar2,local_34);
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  dstCount = (ulong)(int)newSize;
  if (uVar2 == this->bucketCount) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dstCount;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    dst = (SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *)
          Memory::NoCheckHeapAllocator::AllocZero(this->alloc,byteSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<std::type_info_const*,Memory::Recycler::TrackerItem*>,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator>
              (dst,dstCount,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,uVar2,newSize);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<std::type_info_const*,Memory::Recycler::TrackerItem*>,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator>
              ((SimpleDictionaryEntry<const_std::type_info_*,_Memory::Recycler::TrackerItem_*> *)
               newBuckets,dstCount,this->entries,(long)this->count);
    this->modFunctionIndex = local_34[0];
    iVar3 = this->count;
    if (0 < iVar3) {
      lVar6 = 8;
      lVar7 = 0;
      piVar5 = newBuckets;
      do {
        if (-2 < *(int *)((long)piVar5 + lVar6)) {
          hVar4 = PrimePolicy::ModPrime
                            ((uint)(*(ulong *)((long)piVar5 + lVar6 + 8) >> 4) & 0x7fffffff,uVar2,
                             this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar6) = local_48[(int)hVar4];
          local_48[(int)hVar4] = (int)lVar7;
          iVar3 = this->count;
          piVar5 = newBuckets;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x18;
      } while (lVar7 < iVar3);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = (Type)newBuckets;
    this->bucketCount = uVar2;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }